

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

void ggml_graph_dump_dot(ggml_cgraph *gb,ggml_cgraph *gf,char *filename)

{
  ggml_type gVar1;
  ggml_tensor *pgVar2;
  int iVar3;
  FILE *__s;
  ggml_tensor *pgVar4;
  ggml_tensor *pgVar5;
  long lVar6;
  ggml_tensor *pgVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  int64_t iVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  char *pcVar15;
  int64_t iVar16;
  int j_1;
  int j;
  bool bVar17;
  char color [16];
  char label [16];
  undefined8 local_68;
  undefined2 local_60;
  long local_58;
  char *local_50;
  char local_48 [24];
  
  local_50 = filename;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml.c",
               0x186c,"GGML_ASSERT(%s) failed","fp");
  }
  fwrite("digraph G {\n",0xc,1,__s);
  fwrite("  newrank = true;\n",0x12,1,__s);
  fwrite("  rankdir = TB;\n",0x10,1,__s);
  iVar3 = gb->n_nodes;
  if (0 < iVar3) {
    uVar14 = 0;
    do {
      pgVar2 = gb->nodes[uVar14];
      pgVar4 = ggml_graph_get_grad(gb,pgVar2);
      pgVar5 = ggml_graph_get_parent(gb,pgVar2);
      if (pgVar5 == (ggml_tensor *)0x0) {
        if ((pgVar2->flags & 4) == 0) {
          if (pgVar4 == (ggml_tensor *)0x0) {
            local_68 = CONCAT26(local_68._6_2_,0x6500000000);
            local_68 = CONCAT44(local_68._4_4_,0x74696877);
          }
          else if (gf == (ggml_cgraph *)0x0) {
LAB_00122a26:
            local_68 = CONCAT26(local_68._6_2_,0x6e00000000);
            local_68 = CONCAT44(local_68._4_4_,0x65657267);
          }
          else {
            if (0 < (long)gf->n_nodes) {
              lVar12 = 0;
              do {
                if (gf->nodes[lVar12] == pgVar2) goto LAB_00122a26;
                lVar12 = lVar12 + 1;
              } while (gf->n_nodes != lVar12);
            }
            local_68 = 0x756c62746867696c;
            local_60 = 0x65;
          }
        }
        else {
          local_68 = CONCAT17(local_68._7_1_,0x776f6c000000);
          local_68 = CONCAT44(local_68._4_4_,0x6c6c6579);
        }
        fprintf(__s,"  \"%p\" [ style = filled; fillcolor = %s; shape = record; label=\"",pgVar2,
                &local_68);
        gVar1 = pgVar2->type;
        if (pgVar2->name[0] == '\0') {
          pcVar10 = "NONE";
          if (gVar1 < GGML_TYPE_COUNT) {
            pcVar10 = type_traits[gVar1].type_name;
          }
          fprintf(__s,"(%s)|",pcVar10);
        }
        else {
          pcVar10 = "NONE";
          if (gVar1 < GGML_TYPE_COUNT) {
            pcVar10 = type_traits[gVar1].type_name;
          }
          fprintf(__s,"%s (%s)|",pgVar2->name,pcVar10);
        }
        pcVar10 = (char *)pgVar2->ne[2];
        if ((pcVar10 == (char *)0x1) && (pgVar2->ne[3] == 1)) {
          iVar11 = pgVar2->ne[0];
          iVar16 = pgVar2->ne[1];
          pcVar10 = GGML_OP_SYMBOL[pgVar2->op];
          pcVar15 = "%d [%ld, %ld] | <x>%s";
        }
        else {
          iVar11 = pgVar2->ne[0];
          iVar16 = pgVar2->ne[1];
          pcVar15 = "%d [%ld, %ld, %ld] | <x>%s";
        }
        fprintf(__s,pcVar15,uVar14 & 0xffffffff,iVar11,iVar16,pcVar10);
        if (pgVar4 == (ggml_tensor *)0x0) {
          fwrite("\"; ]\n",5,1,__s);
        }
        else {
          fprintf(__s," | <g>%s\"; ]\n",GGML_OP_SYMBOL[pgVar4->op]);
        }
      }
      uVar14 = uVar14 + 1;
      iVar3 = gb->n_nodes;
    } while ((long)uVar14 < (long)iVar3);
  }
  iVar9 = gb->n_leafs;
  if (0 < iVar9) {
    uVar14 = 0;
    do {
      pgVar2 = gb->leafs[uVar14];
      local_68._4_4_ = (uint)((ulong)local_68 >> 0x20) & 0xffffff00;
      local_68 = CONCAT44(local_68._4_4_,0x6b6e6970);
      fprintf(__s,"  \"%p\" [ style = filled; fillcolor = %s; shape = record; label=\"<x>",pgVar2,
              &local_68);
      gVar1 = pgVar2->type;
      if (pgVar2->name[0] == '\0') {
        pcVar10 = "NONE";
        if (gVar1 < GGML_TYPE_COUNT) {
          pcVar10 = type_traits[gVar1].type_name;
        }
        fprintf(__s,"(%s)|",pcVar10);
      }
      else {
        pcVar10 = "NONE";
        if (gVar1 < GGML_TYPE_COUNT) {
          pcVar10 = type_traits[gVar1].type_name;
        }
        fprintf(__s,"%s (%s)|",pgVar2->name,pcVar10);
      }
      fprintf(__s,"CONST %d [%ld, %ld]",uVar14 & 0xffffffff,pgVar2->ne[0],pgVar2->ne[1]);
      if ((pgVar2->ne[1] * pgVar2->ne[0] * pgVar2->ne[2] * pgVar2->ne[3] < 5) &&
         (pgVar2->data != (void *)0x0)) {
        fwrite(" | (",4,1,__s);
        if (0 < pgVar2->ne[1] * pgVar2->ne[0] * pgVar2->ne[2] * pgVar2->ne[3]) {
          lVar12 = 0;
          do {
            fputc(0x23,__s);
            lVar6 = pgVar2->ne[1] * pgVar2->ne[0] * pgVar2->ne[2] * pgVar2->ne[3];
            if (lVar12 < lVar6 + -1) {
              fwrite(", ",2,1,__s);
              lVar6 = pgVar2->ne[1] * pgVar2->ne[0] * pgVar2->ne[2] * pgVar2->ne[3];
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < lVar6);
        }
        fputc(0x29,__s);
      }
      fwrite("\"; ]\n",5,1,__s);
      uVar14 = uVar14 + 1;
      iVar9 = gb->n_leafs;
    } while ((long)uVar14 < (long)iVar9);
    iVar3 = gb->n_nodes;
  }
  if (0 < iVar3) {
    lVar12 = 0;
    do {
      pgVar2 = gb->nodes[lVar12];
      uVar14 = 0;
      local_58 = lVar12;
      do {
        if (pgVar2->src[uVar14] != (ggml_tensor *)0x0) {
          snprintf(local_48,0x10,"src %d",uVar14 & 0xffffffff);
          pgVar4 = pgVar2->src[uVar14];
          pgVar5 = ggml_graph_get_parent(gb,pgVar2);
          pgVar7 = ggml_graph_get_parent(gb,pgVar4);
          if (pgVar7 != (ggml_tensor *)0x0) {
            pgVar4 = pgVar7;
          }
          pcVar15 = "g";
          pcVar10 = "g";
          if (pgVar7 == (ggml_tensor *)0x0) {
            pcVar10 = "x";
          }
          bVar17 = pgVar5 == (ggml_tensor *)0x0;
          if (bVar17) {
            pcVar15 = "x";
            pgVar5 = pgVar2;
          }
          pcVar8 = "empty";
          if (bVar17) {
            pcVar8 = "vee";
          }
          pcVar13 = "dashed";
          if (bVar17) {
            pcVar13 = "solid";
          }
          fprintf(__s,"  \"%p\":%s -> \"%p\":%s [ arrowhead = %s; style = %s; label = \"%s\"; ]\n",
                  pgVar4,pcVar10,pgVar5,pcVar15,pcVar8,pcVar13,local_48);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != 10);
      lVar12 = local_58 + 1;
    } while (lVar12 < gb->n_nodes);
    iVar9 = gb->n_leafs;
  }
  if (0 < iVar9) {
    lVar12 = 0;
    do {
      pgVar2 = gb->leafs[lVar12];
      uVar14 = 0;
      local_58 = lVar12;
      do {
        if (pgVar2->src[uVar14] != (ggml_tensor *)0x0) {
          snprintf(local_48,0x10,"src %d",uVar14 & 0xffffffff);
          fprintf(__s,"  \"%p\":%s -> \"%p\":%s [ label = \"%s\"; ]\n",pgVar2->src[uVar14],"x",
                  pgVar2,"x",local_48);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != 10);
      lVar12 = local_58 + 1;
    } while (lVar12 < gb->n_leafs);
  }
  fwrite("}\n",2,1,__s);
  fclose(__s);
  ggml_log_internal(GGML_LOG_LEVEL_INFO,"%s: dot -Tpng %s -o %s.png && open %s.png\n",
                    "ggml_graph_dump_dot",local_50,local_50,local_50);
  return;
}

Assistant:

void ggml_graph_dump_dot(const struct ggml_cgraph * gb, const struct ggml_cgraph * gf, const char * filename) {
    char color[16];

    FILE * fp = ggml_fopen(filename, "w");
    GGML_ASSERT(fp);

    fprintf(fp, "digraph G {\n");
    fprintf(fp, "  newrank = true;\n");
    fprintf(fp, "  rankdir = TB;\n");

    for (int i = 0; i < gb->n_nodes; i++) {
        struct ggml_tensor * node = gb->nodes[i];
        struct ggml_tensor * grad = ggml_graph_get_grad(gb, node);

        if (ggml_graph_get_parent(gb, node) != NULL) {
            continue;
        }

        if (node->flags & GGML_TENSOR_FLAG_PARAM) {
            snprintf(color, sizeof(color), "yellow");
        } else if (grad) {
            if (ggml_graph_find(gf, node)) {
                snprintf(color, sizeof(color), "green");
            } else {
                snprintf(color, sizeof(color), "lightblue");
            }
        } else {
            snprintf(color, sizeof(color), "white");
        }

        fprintf(fp, "  \"%p\" [ "
                    "style = filled; fillcolor = %s; shape = record; "
                    "label=\"",
                (void *) node, color);

        if (strlen(node->name) > 0) {
            fprintf(fp, "%s (%s)|", node->name, ggml_type_name(node->type));
        } else {
            fprintf(fp, "(%s)|", ggml_type_name(node->type));
        }

        if (ggml_is_matrix(node)) {
            fprintf(fp, "%d [%" PRId64 ", %" PRId64 "] | <x>%s", i, node->ne[0], node->ne[1], ggml_op_symbol(node->op));
        } else {
            fprintf(fp, "%d [%" PRId64 ", %" PRId64 ", %" PRId64 "] | <x>%s", i, node->ne[0], node->ne[1], node->ne[2], ggml_op_symbol(node->op));
        }

        if (grad) {
            fprintf(fp, " | <g>%s\"; ]\n", ggml_op_symbol(grad->op));
        } else {
            fprintf(fp, "\"; ]\n");
        }
    }

    for (int i = 0; i < gb->n_leafs; i++) {
        struct ggml_tensor * node = gb->leafs[i];

        snprintf(color, sizeof(color), "pink");

        fprintf(fp, "  \"%p\" [ "
                    "style = filled; fillcolor = %s; shape = record; "
                    "label=\"<x>",
                (void *) node, color);

        if (strlen(node->name) > 0) {
            fprintf(fp, "%s (%s)|", node->name, ggml_type_name(node->type));
        } else {
            fprintf(fp, "(%s)|", ggml_type_name(node->type));
        }

        fprintf(fp, "CONST %d [%" PRId64 ", %" PRId64 "]", i, node->ne[0], node->ne[1]);
        if (ggml_nelements(node) < 5 && node->data != NULL) {
            fprintf(fp, " | (");
            for (int j = 0; j < ggml_nelements(node); j++) {
                // FIXME: use ggml-backend to obtain the tensor data
                //if (node->type == GGML_TYPE_I8 || node->type == GGML_TYPE_I16 || node->type == GGML_TYPE_I32) {
                //    fprintf(fp, "%d", ggml_get_i32_1d(node, j));
                //}
                //else if (node->type == GGML_TYPE_F32 ||
                //         node->type == GGML_TYPE_F16 ||
                //         node->type == GGML_TYPE_BF16) {
                //    fprintf(fp, "%.1e", (double)ggml_get_f32_1d(node, j));
                //}
                //else
                {
                    fprintf(fp, "#");
                }
                if (j < ggml_nelements(node) - 1) {
                    fprintf(fp, ", ");
                }
            }
            fprintf(fp, ")");
        }
        fprintf(fp, "\"; ]\n");
    }

    for (int i = 0; i < gb->n_nodes; i++) {
        struct ggml_tensor * node = gb->nodes[i];

        for (int j = 0; j < GGML_MAX_SRC; j++) {
            if (node->src[j]) {
                char label[16];
                snprintf(label, sizeof(label), "src %d", j);
                ggml_graph_dump_dot_node_edge(fp, gb, node, node->src[j], label);
            }
        }
    }

    for (int i = 0; i < gb->n_leafs; i++) {
        struct ggml_tensor * node = gb->leafs[i];

        for (int j = 0; j < GGML_MAX_SRC; j++) {
            if (node->src[j]) {
                char label[16];
                snprintf(label, sizeof(label), "src %d", j);
                ggml_graph_dump_dot_leaf_edge(fp, node, node->src[j], label);
            }
        }
    }

    fprintf(fp, "}\n");

    fclose(fp);

    GGML_LOG_INFO("%s: dot -Tpng %s -o %s.png && open %s.png\n", __func__, filename, filename, filename);
}